

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O2

TVariableType __thiscall
Refal2::CVariablesBuilder::checkTypeTag
          (CVariablesBuilder *this,TVariableTypeTag type,CQualifier **defaultQualifierForTag)

{
  char type_00;
  int iVar1;
  CQualifier *pCVar2;
  char *replacement;
  undefined7 in_register_00000031;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  CQualifierBuilder local_210;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 0x4e:
switchD_00135f38_caseD_6e:
    if (defaultQualifierForTag != (CQualifier **)0x0) {
      if ((getDefaultQualifierForN()::qualifier == '\0') &&
         (iVar1 = __cxa_guard_acquire(&getDefaultQualifierForN()::qualifier), iVar1 != 0)) {
        pCVar2 = (CQualifier *)operator_new(0x48);
        CQualifier::CQualifier(pCVar2);
        getDefaultQualifierForN()::qualifier = pCVar2;
        __cxa_guard_release(&getDefaultQualifierForN()::qualifier);
      }
      if (getDefaultQualifierForN()::qualifier == (CQualifier *)0x0) {
        CQualifierBuilder::CQualifierBuilder(&local_210);
        CQualifierBuilder::AddN(&local_210);
        local_210.negative = (bool)(local_210.negative ^ 1);
        CQualifierBuilder::Export(&local_210,getDefaultQualifierForN()::qualifier);
        CQualifierBuilder::~CQualifierBuilder(&local_210);
      }
      *defaultQualifierForTag = getDefaultQualifierForN()::qualifier;
    }
    replacement = "s(N)_";
    type_00 = 'n';
    break;
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x54:
  case 0x55:
switchD_00135f38_caseD_6f:
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_250,'\x01');
    std::operator+(&local_230,"variable type `",&local_250);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210,
                   &local_230,"` doesn\'t exist, allowed variables types: `s`, `w`, `v` or `e`");
    error(this,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    return VT_None;
  case 0x53:
    goto switchD_00135f38_caseD_73;
  case 0x56:
switchD_00135f38_caseD_73:
    return VT_V;
  case 0x57:
switchD_00135f38_caseD_73:
    return VT_W;
  default:
    switch(iVar1) {
    case 0x6e:
      goto switchD_00135f38_caseD_6e;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
      goto switchD_00135f38_caseD_6f;
    case 0x73:
      goto switchD_00135f38_caseD_73;
    case 0x76:
      goto switchD_00135f38_caseD_73;
    case 0x77:
      goto switchD_00135f38_caseD_73;
    default:
      if (iVar1 == 0x45) {
        return VT_E;
      }
      if (iVar1 != 0x46) {
        if (iVar1 == 0x65) {
          return VT_E;
        }
        if (iVar1 != 0x66) goto switchD_00135f38_caseD_6f;
      }
      if (defaultQualifierForTag != (CQualifier **)0x0) {
        if ((getDefaultQualifierForF()::qualifier == '\0') &&
           (iVar1 = __cxa_guard_acquire(&getDefaultQualifierForF()::qualifier), iVar1 != 0)) {
          pCVar2 = (CQualifier *)operator_new(0x48);
          CQualifier::CQualifier(pCVar2);
          getDefaultQualifierForF()::qualifier = pCVar2;
          __cxa_guard_release(&getDefaultQualifierForF()::qualifier);
        }
        if (getDefaultQualifierForF()::qualifier == (CQualifier *)0x0) {
          CQualifierBuilder::CQualifierBuilder(&local_210);
          CQualifierBuilder::AddF(&local_210);
          local_210.negative = (bool)(local_210.negative ^ 1);
          CQualifierBuilder::Export(&local_210,getDefaultQualifierForF()::qualifier);
          CQualifierBuilder::~CQualifierBuilder(&local_210);
        }
        *defaultQualifierForTag = getDefaultQualifierForF()::qualifier;
      }
      replacement = "s(F)_";
      type_00 = 'f';
    }
  }
  warningObsoleteVariableType(this,type_00,replacement);
switchD_00135f38_caseD_73:
  return VT_S;
}

Assistant:

TVariableType CVariablesBuilder::checkTypeTag( const TVariableTypeTag type,
	const CQualifier** defaultQualifierForTag )
{
	switch( type ) {
		case 's':
		case 'S':
			return VT_S;
		case 'w':
		case 'W':
			return VT_W;
		case 'v':
		case 'V':
			return VT_V;
		case 'e':
		case 'E':
			return VT_E;
		case 'n':
		case 'N':
			if( defaultQualifierForTag != nullptr ) {
				*defaultQualifierForTag = getDefaultQualifierForN();
			}
			warningObsoleteVariableType( 'n', "s(N)_" );
			return VT_S;
		case 'f':
		case 'F':
			if( defaultQualifierForTag != nullptr ) {
				*defaultQualifierForTag = getDefaultQualifierForF();
			}
			warningObsoleteVariableType( 'f', "s(F)_" );
			return VT_S;
	}
	error( "variable type `"
		+ std::string( 1, static_cast<char>( type ) )
		+ "` doesn't exist, allowed variables types: `s`, `w`, `v` or `e`" );
	return VT_None;
}